

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O2

qsizetype __thiscall
QDecompressHelper::readBrotli(QDecompressHelper *this,char *data,qsizetype maxSize)

{
  size_t *psVar1;
  void *pvVar2;
  qsizetype qVar3;
  Data *pDVar4;
  char16_t *pcVar5;
  size_t sVar6;
  int iVar7;
  undefined4 uVar8;
  uint8_t *puVar9;
  long distance;
  ulong __n;
  long lVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  qsizetype qStack_c0;
  char *local_a8;
  QBasicUtf8StringView<false> local_a0;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  size_t unusedDecodedSize;
  uint8_t *decodedPtr;
  size_t encodedBytesRemaining;
  uint8_t *encodedPtr;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar2 = this->decoderPointer;
  lVar10 = 0;
  while ((this->decoderHasData == true && (__n = maxSize - lVar10, __n != 0 && lVar10 <= maxSize)))
  {
    if (this->brotliUnconsumedDataPtr != (uint8_t *)0x0) {
      if (this->brotliUnconsumedAmount < __n) {
        __n = this->brotliUnconsumedAmount;
      }
      memcpy(data + lVar10,this->brotliUnconsumedDataPtr,__n);
      this->brotliUnconsumedDataPtr = this->brotliUnconsumedDataPtr + __n;
      lVar10 = lVar10 + __n;
      psVar1 = &this->brotliUnconsumedAmount;
      *psVar1 = *psVar1 - __n;
      if (*psVar1 == 0) {
        this->brotliUnconsumedDataPtr = (uint8_t *)0x0;
        this->decoderHasData = false;
      }
    }
    iVar7 = BrotliDecoderHasMoreOutput(pvVar2);
    if (iVar7 == 1) {
      puVar9 = (uint8_t *)BrotliDecoderTakeOutput(pvVar2,&this->brotliUnconsumedAmount);
      this->brotliUnconsumedDataPtr = puVar9;
      this->decoderHasData = true;
    }
  }
  if (maxSize - lVar10 != 0) {
    QVar11 = QByteDataBuffer::readPointer(&this->compressedDataBuffer);
    distance = QVar11.m_size;
    decodedPtr = (uint8_t *)(data + lVar10);
    unusedDecodedSize = maxSize - lVar10;
    do {
      _encodedBytesRemaining = QVar11;
      sVar6 = unusedDecodedSize;
      if (unusedDecodedSize == 0) {
        QByteDataBuffer::advanceReadPointer
                  (&this->compressedDataBuffer,distance - encodedBytesRemaining);
        maxSize = lVar10;
        break;
      }
      uVar8 = BrotliDecoderDecompressStream
                        (pvVar2,&encodedBytesRemaining,&encodedPtr,&unusedDecodedSize,&decodedPtr,0)
      ;
      lVar10 = (sVar6 - unusedDecodedSize) + lVar10;
      QVar11 = _encodedBytesRemaining;
      maxSize = lVar10;
      switch(uVar8) {
      case 0:
        goto switchD_001d2e76_caseD_0;
      case 1:
        BrotliDecoderDestroyInstance(pvVar2);
        this->decoderPointer = (void *)0x0;
        QByteDataBuffer::clear(&this->compressedDataBuffer);
        goto LAB_001d2ed3;
      case 2:
        QByteDataBuffer::advanceReadPointer(&this->compressedDataBuffer,distance);
        QVar11 = QByteDataBuffer::readPointer(&this->compressedDataBuffer);
        distance = QVar11.m_size;
        if (distance == 0) goto LAB_001d2ed3;
        break;
      case 3:
        iVar7 = BrotliDecoderHasMoreOutput(pvVar2);
        this->decoderHasData = iVar7 != 0;
        QVar11 = _encodedBytesRemaining;
      }
    } while( true );
  }
LAB_001d2ed3:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return maxSize;
switchD_001d2e76_caseD_0:
  QCoreApplication::translate((char *)&local_90,"QHttp","Brotli error: %1",0);
  uVar8 = FUN_001674c0(pvVar2);
  local_a8 = (char *)FUN_00168710(uVar8);
  QBasicUtf8StringView<false>::QBasicUtf8StringView<const_char_*,_true>(&local_a0,&local_a8);
  QString::arg<QBasicUtf8StringView<false>,_true>
            ((QString *)&local_78,(QString *)&local_90,&local_a0,0,(QChar)0x20);
  pDVar4 = (this->errorStr).d.d;
  pcVar5 = (this->errorStr).d.ptr;
  (this->errorStr).d.d = local_78.d;
  (this->errorStr).d.ptr = local_78.ptr;
  qVar3 = (this->errorStr).d.size;
  (this->errorStr).d.size = local_78.size;
  local_78.d = pDVar4;
  local_78.ptr = pcVar5;
  local_78.size = qVar3;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
  qStack_c0 = -1;
  maxSize = qStack_c0;
  goto LAB_001d2ed3;
}

Assistant:

qsizetype QDecompressHelper::readBrotli(char *data, const qsizetype maxSize)
{
#if !QT_CONFIG(brotli)
    Q_UNUSED(data);
    Q_UNUSED(maxSize);
    Q_UNREACHABLE();
#else
    qint64 bytesDecoded = 0;

    BrotliDecoderState *brotliDecoderState = toBrotliPointer(decoderPointer);

    while (decoderHasData && bytesDecoded < maxSize) {
        Q_ASSERT(brotliUnconsumedDataPtr || BrotliDecoderHasMoreOutput(brotliDecoderState));
        if (brotliUnconsumedDataPtr) {
            Q_ASSERT(brotliUnconsumedAmount);
            size_t toRead = std::min(size_t(maxSize - bytesDecoded), brotliUnconsumedAmount);
            memcpy(data + bytesDecoded, brotliUnconsumedDataPtr, toRead);
            bytesDecoded += toRead;
            brotliUnconsumedAmount -= toRead;
            brotliUnconsumedDataPtr += toRead;
            if (brotliUnconsumedAmount == 0) {
                brotliUnconsumedDataPtr = nullptr;
                decoderHasData = false;
            }
        }
        if (BrotliDecoderHasMoreOutput(brotliDecoderState) == BROTLI_TRUE) {
            brotliUnconsumedDataPtr =
                    BrotliDecoderTakeOutput(brotliDecoderState, &brotliUnconsumedAmount);
            decoderHasData = true;
        }
    }
    if (bytesDecoded == maxSize)
        return bytesDecoded;
    Q_ASSERT(bytesDecoded < maxSize);

    QByteArrayView input = compressedDataBuffer.readPointer();
    const uint8_t *encodedPtr = reinterpret_cast<const uint8_t *>(input.data());
    size_t encodedBytesRemaining = input.size();

    uint8_t *decodedPtr = reinterpret_cast<uint8_t *>(data + bytesDecoded);
    size_t unusedDecodedSize = size_t(maxSize - bytesDecoded);
    while (unusedDecodedSize > 0) {
        auto previousUnusedDecodedSize = unusedDecodedSize;
        BrotliDecoderResult result = BrotliDecoderDecompressStream(
                brotliDecoderState, &encodedBytesRemaining, &encodedPtr, &unusedDecodedSize,
                &decodedPtr, nullptr);
        bytesDecoded += previousUnusedDecodedSize - unusedDecodedSize;

        switch (result) {
        Q_UNLIKELY_BRANCH
        case BROTLI_DECODER_RESULT_ERROR:
            //: Brotli (compression algorithm) decoding error, e.g. corrupted input or memory allocation problem.
            errorStr = QCoreApplication::translate("QHttp", "Brotli error: %1")
                           .arg(QUtf8StringView{BrotliDecoderErrorString(
                               BrotliDecoderGetErrorCode(brotliDecoderState))});
            return -1;
        case BROTLI_DECODER_RESULT_SUCCESS:
            BrotliDecoderDestroyInstance(brotliDecoderState);
            decoderPointer = nullptr;
            compressedDataBuffer.clear();
            return bytesDecoded;
        case BROTLI_DECODER_RESULT_NEEDS_MORE_INPUT:
            compressedDataBuffer.advanceReadPointer(input.size());
            input = compressedDataBuffer.readPointer();
            if (!input.isEmpty()) {
                encodedPtr = reinterpret_cast<const uint8_t *>(input.constData());
                encodedBytesRemaining = input.size();
                break;
            }
            return bytesDecoded;
        case BROTLI_DECODER_RESULT_NEEDS_MORE_OUTPUT:
            // Some data is leftover inside the brotli decoder, remember for next time
            decoderHasData = BrotliDecoderHasMoreOutput(brotliDecoderState);
            Q_ASSERT(unusedDecodedSize == 0);
            break;
        }
    }
    compressedDataBuffer.advanceReadPointer(input.size() - encodedBytesRemaining);
    return bytesDecoded;
#endif
}